

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O1

Element * Rml::ElementUtilities::GetElementById(Element *root_element,String *id)

{
  size_t __n;
  Element *pEVar1;
  int iVar2;
  int iVar3;
  String *pSVar4;
  int i;
  Element *pEVar5;
  bool bVar6;
  SearchQueue search_queue;
  Element *local_a0;
  Element *local_98;
  Element *local_90;
  _Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a0 = root_element;
  ::std::_Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>::_M_initialize_map
            (&local_88,0);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    ::std::deque<Rml::Element*,std::allocator<Rml::Element*>>::_M_push_back_aux<Rml::Element*const&>
              ((deque<Rml::Element*,std::allocator<Rml::Element*>> *)&local_88,&local_a0);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_a0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  do {
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
      pEVar5 = (Element *)0x0;
      break;
    }
    pEVar5 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_88._M_impl.super__Deque_impl_data._M_start._M_last =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
      local_88._M_impl.super__Deque_impl_data._M_start._M_first =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_88._M_impl.super__Deque_impl_data._M_start._M_node =
           local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    pSVar4 = Element::GetId_abi_cxx11_(pEVar5);
    __n = pSVar4->_M_string_length;
    if (__n == id->_M_string_length) {
      if (__n == 0) {
        bVar6 = true;
      }
      else {
        iVar2 = bcmp((pSVar4->_M_dataplus)._M_p,(id->_M_dataplus)._M_p,__n);
        bVar6 = iVar2 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    pEVar1 = pEVar5;
    if (!bVar6) {
      for (iVar2 = 0; iVar3 = Element::GetNumChildren(pEVar5,false), pEVar1 = local_98,
          iVar2 < iVar3; iVar2 = iVar2 + 1) {
        local_90 = Element::GetChild(pEVar5,iVar2);
        ::std::deque<Rml::Element*,std::allocator<Rml::Element*>>::emplace_back<Rml::Element*>
                  ((deque<Rml::Element*,std::allocator<Rml::Element*>> *)&local_88,&local_90);
      }
    }
    local_98 = pEVar1;
    pEVar5 = local_98;
  } while (!bVar6);
  ::std::_Deque_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~_Deque_base(&local_88);
  return pEVar5;
}

Assistant:

Element* ElementUtilities::GetElementById(Element* root_element, const String& id)
{
	// Breadth first search on elements for the corresponding id
	typedef Queue<Element*> SearchQueue;
	SearchQueue search_queue;
	search_queue.push(root_element);

	while (!search_queue.empty())
	{
		Element* element = search_queue.front();
		search_queue.pop();

		if (element->GetId() == id)
		{
			return element;
		}

		// Add all children to search
		for (int i = 0; i < element->GetNumChildren(); i++)
			search_queue.push(element->GetChild(i));
	}

	return nullptr;
}